

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lasquadtree.cpp
# Opt level: O2

void __thiscall
LASquadtree::raster_occupancy
          (LASquadtree *this,_func_BOOL_I32 *does_cell_exist,U32 *data,U32 min_x,U32 min_y,
          U32 level_index,U32 level,U32 stop_level)

{
  BOOL BVar1;
  U32 UVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  bool bVar7;
  int local_64;
  
  local_64 = stop_level - level;
  while( true ) {
    UVar2 = get_cell_index(this,level_index,level);
    if ((this->adaptive[UVar2 >> 5] >> (UVar2 & 0x1f) & 1) == 0) {
      BVar1 = (*does_cell_exist)(UVar2);
      if (BVar1) {
        iVar6 = 1 << ((byte)local_64 & 0x1f);
        uVar4 = iVar6 + min_y;
        for (; min_y < uVar4; min_y = min_y + 1) {
          uVar3 = (min_y << ((byte)stop_level & 0x1f)) + min_x;
          iVar5 = iVar6;
          while (bVar7 = iVar5 != 0, iVar5 = iVar5 + -1, bVar7) {
            data[uVar3 >> 5] = data[uVar3 >> 5] | 1 << ((byte)uVar3 & 0x1f);
            uVar3 = uVar3 + 1;
          }
        }
      }
      return;
    }
    if (stop_level <= level) break;
    level = level + 1;
    local_64 = local_64 + -1;
    iVar6 = 1 << ((byte)local_64 & 0x1f);
    raster_occupancy(this,does_cell_exist,data,min_x,min_y,level_index * 4,level,stop_level);
    UVar2 = iVar6 + min_x;
    raster_occupancy(this,does_cell_exist,data,UVar2,min_y,level_index * 4 + 1,level,stop_level);
    min_y = iVar6 + min_y;
    raster_occupancy(this,does_cell_exist,data,min_x,min_y,level_index * 4 + 2,level,stop_level);
    level_index = level_index * 4 + 3;
    min_x = UVar2;
  }
  iVar6 = 1 << ((byte)local_64 & 0x1f);
  uVar4 = iVar6 + min_y;
  for (; min_y < uVar4; min_y = min_y + 1) {
    uVar3 = (min_y << ((byte)stop_level & 0x1f)) + min_x;
    iVar5 = iVar6;
    while (bVar7 = iVar5 != 0, iVar5 = iVar5 + -1, bVar7) {
      data[uVar3 >> 5] = data[uVar3 >> 5] | 1 << ((byte)uVar3 & 0x1f);
      uVar3 = uVar3 + 1;
    }
  }
  return;
}

Assistant:

void LASquadtree::raster_occupancy(BOOL(*does_cell_exist)(I32), U32* data, U32 min_x, U32 min_y, U32 level_index, U32 level, U32 stop_level) const
{
  U32 cell_index = get_cell_index(level_index, level);
  U32 adaptive_pos = cell_index/32;
  U32 adaptive_bit = ((U32)1) << (cell_index%32);
  // have we reached a leaf
  if (adaptive[adaptive_pos] & adaptive_bit) // interior node
  {
    if (level < stop_level) // do we need to continue
    {
      level_index <<= 2;
      level += 1;
      U32 size = 1 << (stop_level-level);
      // recurse into the four children
      raster_occupancy(does_cell_exist, data, min_x, min_y, level_index, level, stop_level);
      raster_occupancy(does_cell_exist, data, min_x+size, min_y, level_index + 1, level, stop_level);
      raster_occupancy(does_cell_exist, data, min_x, min_y+size, level_index + 2, level, stop_level);
      raster_occupancy(does_cell_exist, data, min_x+size, min_y+size, level_index + 3, level, stop_level);
      return;
    }
    else // no ... raster remaining subtree
    {
      U32 full_size = (1 << stop_level);
      U32 size = 1 << (stop_level-level);
      U32 max_y = min_y + size;
      U32 pos, pos_x, pos_y;
      for (pos_y = min_y; pos_y < max_y; pos_y++)
      {
        pos = pos_y*full_size + min_x;
        for (pos_x = 0; pos_x < size; pos_x++)
        {
          data[pos/32] |= (1<<(pos%32));
          pos++;
        }
      }
    }
  }
  else if (does_cell_exist(cell_index))
  {
    // raster actual cell
    U32 full_size = (1 << stop_level);
    U32 size = 1 << (stop_level-level);
    U32 max_y = min_y + size;
    U32 pos, pos_x, pos_y;
    for (pos_y = min_y; pos_y < max_y; pos_y++)
    {
      pos = pos_y*full_size + min_x;
      for (pos_x = 0; pos_x < size; pos_x++)
      {
        data[pos/32] |= (1<<(pos%32));
        pos++;
      }
    }
  }
}